

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::EnhancedLayouts::BufferTestBase::testCase(BufferTestBase *this,GLuint test_case_index)

{
  ostringstream *this_00;
  int iVar1;
  TestLog *pTVar2;
  bool bVar3;
  undefined4 in_register_00000034;
  char *local_588 [4];
  char *local_568 [4];
  char *local_548 [4];
  VertexArray vao;
  Vector descriptors;
  bufferCollection buffers;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  Program program;
  NameVector captured_varyings;
  char *local_3b0 [4];
  char *local_390 [4];
  char *local_370 [4];
  char *local_350 [4];
  stringstream stream;
  undefined1 local_1a8 [384];
  
  buffers.m_vector.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffers.m_vector.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buffers.m_vector.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  captured_varyings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  captured_varyings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  captured_varyings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptors.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptors.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptors.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vao.m_context = (this->super_TestBase).super_TestCase.m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  vao.m_id = 0xffffffff;
  program.m_compute.m_context = vao.m_context;
  program.m_fragment.m_context = vao.m_context;
  program.m_geometry.m_context = vao.m_context;
  program.m_tess_ctrl.m_context = vao.m_context;
  program.m_tess_eval.m_context = vao.m_context;
  program.m_vertex.m_context = vao.m_context;
  program.m_context = vao.m_context;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xb])
            (this,CONCAT44(in_register_00000034,test_case_index),&captured_varyings);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_478,this,test_case_index,5);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_498,this,test_case_index,4);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_4b8,this,test_case_index,2);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_4d8,this,test_case_index,3);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_458,this,test_case_index,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stream,glcts::fixed_sample_locations_values + 1,(allocator<char> *)local_1a8
            );
  Utils::Program::Init
            (&program,(string *)&stream,&local_478,&local_498,&local_4b8,&local_4d8,&local_458,
             &captured_varyings,true,false);
  std::__cxx11::string::~string((string *)&stream);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])
                    (this,test_case_index,&program,&stream);
  if ((char)iVar1 == '\0') {
    local_1a8._0_8_ = ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Program inspection failed. Test case: ");
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
              (local_548,this,test_case_index);
    std::operator<<((ostream *)this_00,(string *)local_548);
    std::operator<<((ostream *)this_00,". Reason: ");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this_00,(string *)local_568);
    pTVar2 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string((string *)local_588,(string *)&local_458);
    tcu::TestLog::writeKernelSource(pTVar2,local_588[0]);
    std::__cxx11::string::string((string *)local_350,(string *)&local_4b8);
    tcu::TestLog::writeKernelSource(pTVar2,local_350[0]);
    std::__cxx11::string::string((string *)local_370,(string *)&local_4d8);
    tcu::TestLog::writeKernelSource(pTVar2,local_370[0]);
    std::__cxx11::string::string((string *)local_390,(string *)&local_498);
    tcu::TestLog::writeKernelSource(pTVar2,local_390[0]);
    std::__cxx11::string::string((string *)local_3b0,(string *)&local_478);
    tcu::TestLog::writeKernelSource(pTVar2,local_3b0[0]);
    std::__cxx11::string::~string((string *)local_3b0);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::~string((string *)local_588);
    std::__cxx11::string::~string((string *)local_568);
    std::__cxx11::string::~string((string *)local_548);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  else {
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    Utils::Program::Use(&program);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[10])
              (this,test_case_index,&descriptors);
    cleanBuffers(this);
    prepareBuffers(this,&descriptors,&buffers);
    Utils::VertexArray::Init(&vao);
    Utils::VertexArray::Bind(&vao);
    iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
                      (this,(ulong)(program.m_tess_eval.m_id != 0),test_case_index);
    if ((char)iVar1 == '\0') {
      pTVar2 = ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
      std::__cxx11::string::string((string *)&stream,(string *)&local_458);
      tcu::TestLog::writeKernelSource(pTVar2,_stream);
      std::__cxx11::string::string((string *)local_1a8,(string *)&local_4b8);
      tcu::TestLog::writeKernelSource(pTVar2,(char *)local_1a8._0_8_);
      std::__cxx11::string::string((string *)local_548,(string *)&local_4d8);
      tcu::TestLog::writeKernelSource(pTVar2,local_548[0]);
      std::__cxx11::string::string((string *)local_568,(string *)&local_498);
      tcu::TestLog::writeKernelSource(pTVar2,local_568[0]);
      std::__cxx11::string::string((string *)local_588,(string *)&local_478);
      tcu::TestLog::writeKernelSource(pTVar2,local_588[0]);
    }
    else {
      iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
                [0x10])(this,&buffers);
      bVar3 = true;
      if ((char)iVar1 != '\0') goto LAB_009560aa;
      pTVar2 = ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
      std::__cxx11::string::string((string *)&stream,(string *)&local_458);
      tcu::TestLog::writeKernelSource(pTVar2,_stream);
      std::__cxx11::string::string((string *)local_1a8,(string *)&local_4b8);
      tcu::TestLog::writeKernelSource(pTVar2,(char *)local_1a8._0_8_);
      std::__cxx11::string::string((string *)local_548,(string *)&local_4d8);
      tcu::TestLog::writeKernelSource(pTVar2,local_548[0]);
      std::__cxx11::string::string((string *)local_568,(string *)&local_498);
      tcu::TestLog::writeKernelSource(pTVar2,local_568[0]);
      std::__cxx11::string::string((string *)local_588,(string *)&local_478);
      tcu::TestLog::writeKernelSource(pTVar2,local_588[0]);
    }
    std::__cxx11::string::~string((string *)local_588);
    std::__cxx11::string::~string((string *)local_568);
    std::__cxx11::string::~string((string *)local_548);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string((string *)&stream);
  }
  bVar3 = false;
LAB_009560aa:
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  Utils::VertexArray::~VertexArray(&vao);
  Utils::Program::~Program(&program);
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::~vector(&descriptors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&captured_varyings);
  bufferCollection::~bufferCollection(&buffers);
  return bVar3;
}

Assistant:

bool BufferTestBase::testCase(GLuint test_case_index)
{
	try
	{
		bufferCollection		   buffers;
		Utils::Program::NameVector captured_varyings;
		bufferDescriptor::Vector   descriptors;
		Utils::Program			   program(m_context);
		Utils::VertexArray		   vao(m_context);

		/* Get captured varyings */
		getCapturedVaryings(test_case_index, captured_varyings);

		/* Get shader sources */
		const std::string& fragment_shader  = getShaderSource(test_case_index, Utils::Shader::FRAGMENT);
		const std::string& geometry_shader  = getShaderSource(test_case_index, Utils::Shader::GEOMETRY);
		const std::string& tess_ctrl_shader = getShaderSource(test_case_index, Utils::Shader::TESS_CTRL);
		const std::string& tess_eval_shader = getShaderSource(test_case_index, Utils::Shader::TESS_EVAL);
		const std::string& vertex_shader	= getShaderSource(test_case_index, Utils::Shader::VERTEX);

		/* Set up program */
		program.Init("" /* compute_shader */, fragment_shader, geometry_shader, tess_ctrl_shader, tess_eval_shader,
					 vertex_shader, captured_varyings, true, false /* is_separable */);

		/* Inspection */
		{
			std::stringstream stream;
			if (false == inspectProgram(test_case_index, program, stream))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Program inspection failed. Test case: " << getTestCaseName(test_case_index)
					<< ". Reason: " << stream.str() << tcu::TestLog::EndMessage
					<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
					<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
					<< tcu::TestLog::KernelSource(fragment_shader);

				return false;
			}
		}

		program.Use();

		/* Set up buffers */
		getBufferDescriptors(test_case_index, descriptors);
		cleanBuffers();
		prepareBuffers(descriptors, buffers);

		/* Set up vao */
		vao.Init();
		vao.Bind();

		/* Draw */
		bool result = executeDrawCall((program.m_tess_eval.m_id != 0), test_case_index);

#if USE_NSIGHT
		m_context.getRenderContext().postIterate();
#endif

		if (false == result)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
				<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
				<< tcu::TestLog::KernelSource(fragment_shader);

			return false;
		}

		/* Verify result */
		if (false == verifyBuffers(buffers))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
				<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
				<< tcu::TestLog::KernelSource(fragment_shader);

			return false;
		}
	}
	catch (Utils::Shader::InvalidSourceException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}
	catch (Utils::Program::BuildException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}

	/* Done */
	return true;
}